

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

void __thiscall
Semantic::Err::UndeclaredLocalVariable::UndeclaredLocalVariable
          (UndeclaredLocalVariable *this,string *varName)

{
  string *varName_local;
  UndeclaredLocalVariable *this_local;
  
  this->super_Error = (Error)0x0;
  Error::Error(&this->super_Error);
  this->super_Error = (Error)&PTR__UndeclaredLocalVariable_001a3338;
  std::__cxx11::string::string((string *)&this->varName);
  std::__cxx11::string::operator=((string *)&this->varName,(string *)varName);
  return;
}

Assistant:

UndeclaredLocalVariable(std::string varName) : Error() {
                this->varName = varName;
            }